

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_ldpc_file_formats.hpp
# Opt level: O0

pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
* __thiscall
LDPC4QKD::read_matrix_from_cscmat<unsigned_int,unsigned_int>
          (pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           *__return_storage_ptr__,LDPC4QKD *this,string *file_path)

{
  byte bVar1;
  bool bVar2;
  runtime_error *this_00;
  istream *piVar3;
  reference pvVar4;
  bool bVar5;
  stringstream s_1;
  exception *e;
  stringstream s;
  undefined1 local_280 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> rowval;
  vector<unsigned_int,_std::allocator<unsigned_int>_> colptr;
  string current_line;
  long local_220;
  ifstream fs;
  string *file_path_local;
  
  std::ifstream::ifstream(&local_220,this,8);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Stream object invalid.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string
            ((string *)
             &colptr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  do {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_220,
                        (string *)
                        &colptr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    bVar5 = false;
    if (bVar2) {
      pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &colptr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      bVar5 = *pvVar4 == '#';
    }
  } while (bVar5);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&local_220,
             (string *)
             &colptr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&local_220,
             (string *)
             &colptr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  HelpersReadFilesLDPC::helper_parse_space_sep_ints<unsigned_int>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &rowval.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (string *)
             &colptr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&local_220,
             (string *)
             &colptr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&local_220,
             (string *)
             &colptr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  HelpersReadFilesLDPC::helper_parse_space_sep_ints<unsigned_int>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_280,
             (string *)
             &colptr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  make_pair<std::vector<unsigned_int,std::allocator<unsigned_int>>&,std::vector<unsigned_int,std::allocator<unsigned_int>>&>
            (__return_storage_ptr__,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &rowval.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_280);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_280);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &rowval.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &colptr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::ifstream::~ifstream(&local_220);
  return __return_storage_ptr__;
}

Assistant:

std::pair <std::vector<colptr_t>, std::vector<idx_t>> read_matrix_from_cscmat(const std::string &file_path) {
        try {
            std::ifstream fs(file_path);
            if (!fs) {
                throw std::runtime_error("Stream object invalid.");
            }

            std::string current_line;

            while (getline(fs, current_line) && current_line[0] == '#') {
                // Do nothing. Ignores comments at the beginning of the file.
            }

            getline(fs, current_line); // ignores metadata
            getline(fs, current_line);
            std::vector<colptr_t> colptr = HelpersReadFilesLDPC::helper_parse_space_sep_ints<colptr_t>(current_line);

            getline(fs, current_line); // ignores empty line
            getline(fs, current_line);
            std::vector<idx_t> rowval = HelpersReadFilesLDPC::helper_parse_space_sep_ints<idx_t>(current_line);

            return std::make_pair(colptr, rowval);
        }
        catch (const std::exception &e) {
            std::stringstream s;
            s << "Failed to read LDPC code from file '" << file_path << "'. Reason:\n" << e.what() << "\n";
            throw std::runtime_error(s.str());
        }
        catch (...) {
            std::stringstream s;
            s << "Failed to read LDPC code from file '" << file_path << "' due to unknown error.";
            throw std::runtime_error(s.str());
        }
    }